

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O0

string * __thiscall pbrt::LightBounds::ToString_abi_cxx11_(LightBounds *this)

{
  float *unaff_RBX;
  string *in_RDI;
  float *unaff_retaddr;
  Vector3<float> *in_stack_00000008;
  Bounds3<float> *in_stack_00000010;
  char *in_stack_00000018;
  float *in_stack_00000040;
  float *in_stack_00000048;
  float *in_stack_00000050;
  bool *in_stack_00000058;
  
  StringPrintf<pbrt::Bounds3<float>const&,pbrt::Vector3<float>const&,float_const&,float_const&,float_const&,float_const&,float_const&,bool_const&>
            (in_stack_00000018,in_stack_00000010,in_stack_00000008,unaff_retaddr,unaff_RBX,
             in_stack_00000040,in_stack_00000048,in_stack_00000050,in_stack_00000058);
  return in_RDI;
}

Assistant:

std::string LightBounds::ToString() const {
    return StringPrintf("[ LightBounds b: %s w: %s phi: %f theta_o: %f theta_e: %f "
                        "cosTheta_o: %f cosTheta_e: %f twoSided: %s ]",
                        b, w, phi, theta_o, theta_e, cosTheta_o, cosTheta_e, twoSided);
}